

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# busyindicator.cpp
# Opt level: O2

void __thiscall QtMWidgets::BusyIndicator::BusyIndicator(BusyIndicator *this,QWidget *parent)

{
  BusyIndicatorPrivate *this_00;
  BusyIndicator *ctx;
  
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_001ba080;
  *(undefined **)&this->field_0x10 = &DAT_001ba230;
  this_00 = (BusyIndicatorPrivate *)operator_new(0x38);
  ctx = this;
  BusyIndicatorPrivate::BusyIndicatorPrivate(this_00,this);
  (this->d).d = this_00;
  BusyIndicatorPrivate::init(this_00,(EVP_PKEY_CTX *)ctx);
  return;
}

Assistant:

BusyIndicator::BusyIndicator( QWidget * parent )
	:	QWidget( parent )
	,	d( new BusyIndicatorPrivate( this ) )
{
	d->init();
}